

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_reserve_success_enoughCapacity_fn(int _i)

{
  AString string_00;
  bool bVar1;
  int iVar2;
  char *in_stack_fffffffffffffe50;
  uintmax_t _ck_y_11;
  uintmax_t _ck_x_14;
  uintmax_t _ck_y_10;
  uintmax_t _ck_x_13;
  char *_ck_y_q_2;
  char *_ck_x_q_2;
  char *_ck_y_s_2;
  char *_ck_x_s_2;
  char *_ck_y_9;
  char *_ck_x_12;
  void *_ck_x_11;
  uintmax_t _ck_y_8;
  uintmax_t _ck_x_10;
  uintmax_t _ck_y_7;
  uintmax_t _ck_x_9;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_5;
  char *_ck_x_7;
  void *_ck_x_6;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"012",0x10);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  bVar1 = AString_reserve((AString *)&_ck_x,0);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x13b,"Assertion \'AString_reserve(&string, 0)\' failed",0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x13b);
  if (string.size != 0x10) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x13c,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (16)",
                      "(string).capacity",string.size,"(16)",0x10,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x13c);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x13c,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x13c);
  _ck_y_s = (char *)string.capacity;
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("012",(char *)string.capacity);
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x13c);
      if (string.deallocator != (ACUtilsDeallocator)0x3) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x13c,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\"012\")","(string).size",string.deallocator,
                          "strlen(\"012\")",3,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x13c);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x13d,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtilsTest_AString_reallocCount == (0)",
                          "private_ACUtilsTest_AString_reallocCount",
                          private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x13d);
      bVar1 = AString_reserve((AString *)&_ck_x,1);
      if (bVar1 == false) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x13e,"Assertion \'AString_reserve(&string, 1)\' failed",0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x13e);
      if (string.size != 0x10) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x13f,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).capacity == (16)","(string).capacity",string.size,"(16)",0x10,0)
        ;
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x13f);
      if (string.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x13f,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                          "(void*) (string).buffer",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x13f);
      _ck_y_s_1 = (char *)string.capacity;
      if (string.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar2 = strcmp("012",(char *)string.capacity);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x13f);
          if (string.deallocator != (ACUtilsDeallocator)0x3) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x13f,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(string).size == strlen(\"012\")","(string).size",string.deallocator,
                              "strlen(\"012\")",3,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x13f);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x140,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "private_ACUtilsTest_AString_reallocCount == (0)",
                              "private_ACUtilsTest_AString_reallocCount",
                              private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x140);
          bVar1 = AString_reserve((AString *)&_ck_x,0x10);
          if (bVar1 == false) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x141,"Assertion \'AString_reserve(&string, 16)\' failed",0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x141);
          if (string.size == 0x10) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x142);
            if (string.capacity == 0) {
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x142,"Assertion \'_ck_x != NULL\' failed",
                                "Assertion \'%s\' failed: %s == %#x",
                                "(void*) (string).buffer != NULL","(void*) (string).buffer",0,0);
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x142);
            _ck_y_s_2 = (char *)string.capacity;
            if (string.capacity == 0) {
              _ck_y_q_2 = "";
              _ck_y_s_2 = "(null)";
            }
            else {
              _ck_y_q_2 = "\"";
              iVar2 = strcmp("012",(char *)string.capacity);
              if (iVar2 == 0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x142);
                if (string.deallocator != (ACUtilsDeallocator)0x3) {
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x142,"Assertion \'_ck_x == _ck_y\' failed",
                                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                    "(string).size == strlen(\"012\")","(string).size",
                                    string.deallocator,"strlen(\"012\")",3,0);
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x142);
                if (private_ACUtilsTest_AString_reallocCount == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x143);
                  string_00.deallocator = string.deallocator;
                  string_00.reallocator = string.reallocator;
                  string_00.size = string.size;
                  string_00.capacity = string.capacity;
                  string_00.buffer = in_stack_fffffffffffffe50;
                  private_ACUtilsTest_AString_destructTestString(string_00);
                  return;
                }
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x143,"Assertion \'_ck_x == _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                  "private_ACUtilsTest_AString_reallocCount == (0)",
                                  "private_ACUtilsTest_AString_reallocCount",
                                  private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
              }
            }
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x142,
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                              "(string).buffer == (\"012\")","(string).buffer",_ck_y_q_2,_ck_y_s_2,
                              _ck_y_q_2,"(\"012\")","\"","012","\"",0);
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x142,"Assertion \'_ck_x == _ck_y\' failed",
                            "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                            "(string).capacity == (16)","(string).capacity",string.size,"(16)",0x10,
                            0);
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x13f,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(string).buffer == (\"012\")","(string).buffer",_ck_y_q_1,_ck_y_s_1,
                        _ck_y_q_1,"(\"012\")","\"","012","\"",0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x13c,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\"012\")","(string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                    "(\"012\")","\"","012","\"",0);
}

Assistant:

START_TEST(test_AString_reserve_success_enoughCapacity)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012", 16);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_reserve(&string, 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_reserve(&string, 1));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_reserve(&string, 16));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}